

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall tinyusdz::crate::CrateReader::ReadString(CrateReader *this,string *s)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  byte unaff_BPL;
  char *pcVar4;
  Index string_index;
  optional<tinyusdz::Token> tok;
  ostringstream ss_e;
  Index local_1ec;
  optional<tinyusdz::Token> local_1e8;
  ostringstream local_1a0 [376];
  
  local_1ec.value = 0xffffffff;
  bVar1 = ReadIndex(this,&local_1ec);
  if (bVar1) {
    GetStringToken(&local_1e8,this,local_1ec);
    if (local_1e8.has_value_ == true) {
      nonstd::optional_lite::optional<tinyusdz::Token>::value(&local_1e8);
      ::std::__cxx11::string::_M_assign((string *)s);
      uVar2 = this->_memoryUsage + s->_M_string_length;
      this->_memoryUsage = uVar2;
      unaff_BPL = 1;
      if ((this->_config).maxMemoryBudget < uVar2) {
        ::std::__cxx11::ostringstream::ostringstream(local_1a0);
        poVar3 = ::std::operator<<((ostream *)local_1a0,"[error]");
        poVar3 = ::std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar3 = ::std::operator<<(poVar3,"[Crate]");
        poVar3 = ::std::operator<<(poVar3,":");
        poVar3 = ::std::operator<<(poVar3,"ReadString");
        poVar3 = ::std::operator<<(poVar3,"():");
        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xff);
        ::std::operator<<(poVar3," ");
        poVar3 = ::std::operator<<((ostream *)local_1a0,"Reached to max memory budget.");
        ::std::operator<<(poVar3,"\n");
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::append((string *)&this->_err);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
        unaff_BPL = 0;
      }
    }
    nonstd::optional_lite::optional<tinyusdz::Token>::~optional(&local_1e8);
    if (local_1e8.has_value_ != false) goto LAB_001752e6;
    ::std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar3 = ::std::operator<<((ostream *)local_1a0,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"ReadString");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x104);
    ::std::operator<<(poVar3," ");
    pcVar4 = "Invalid StringIndex.";
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar3 = ::std::operator<<((ostream *)local_1a0,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"ReadString");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xf9);
    ::std::operator<<(poVar3," ");
    pcVar4 = "Failed to read Index for string data.";
  }
  poVar3 = ::std::operator<<((ostream *)local_1a0,pcVar4);
  ::std::operator<<(poVar3,"\n");
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::append((string *)&this->_err);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
  unaff_BPL = 0;
LAB_001752e6:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool CrateReader::ReadString(std::string *s) {
  // string is serialized as StringIndex
  crate::Index string_index;
  if (!ReadIndex(&string_index)) {
    PUSH_ERROR("Failed to read Index for string data.");
    return false;
  }

  if (auto tok = GetStringToken(string_index)) {
    (*s) = tok.value().str();
    CHECK_MEMORY_USAGE(s->size());
    return true;
  }


  PUSH_ERROR("Invalid StringIndex.");
  return false;
}